

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O2

void __thiscall chrono::fea::ChExtruderBeamEuler::Update(ChExtruderBeamEuler *this)

{
  ChQuaternion<double> *this_00;
  ChQuaternion<double> *pCVar1;
  ChMesh *pCVar2;
  element_type *peVar3;
  ChLinkMotorLinearSpeed *this_01;
  ChContactSurfaceNodeCloud *this_02;
  double dVar4;
  element_type *peVar5;
  _func_int **pp_Var6;
  __shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2> *this_03;
  undefined1 auVar7 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> node0;
  value_type node1;
  shared_ptr<chrono::fea::ChElementBeamEuler> element;
  ChVector<double> v;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_3b8;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_3a8;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_398 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_390;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_388 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_380;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_378;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_358;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_348 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_340;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_338 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_330;
  ChFrame<double> local_328;
  shared_ptr<chrono::ChFunction> local_298;
  ChCoordsys<double> local_288;
  __shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2> local_248;
  ChCoordsys<double> local_238;
  ChVector<double> local_1f8;
  ChVector<double> local_1d8;
  ChFrame<double> local_1c0;
  ChFrame<double> local_138;
  ChFrame<double> local_b0;
  
  std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3a8,
             &(this->beam_nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
  local_1d8.m_data[0] = *(double *)&((local_3a8._M_ptr)->super_ChNodeFEAbase).field_0x20;
  local_1d8.m_data[1] = *(double *)&(local_3a8._M_ptr)->field_0x28;
  local_1d8.m_data[2] = *(double *)&(local_3a8._M_ptr)->field_0x30;
  ChCoordsys<double>::TransformParentToLocal
            ((ChVector<double> *)&local_328,&this->outlet,&local_1d8);
  if (0.0 <= (double)local_328._vptr_ChFrame) {
    dVar4 = (double)local_328._vptr_ChFrame - this->h;
    this_00 = &(this->outlet).rot;
    local_288.pos.m_data[0] = 0.0;
    local_288.pos.m_data[1] = 0.0;
    local_288.pos.m_data[2] = 0.0;
    local_288.rot.m_data[0] = 1.0;
    local_288.rot.m_data[3] = 0.0;
    local_288.rot.m_data[1] = 0.0;
    local_288.rot.m_data[2] = 0.0;
    if (this_00 != &local_288.rot) {
      local_288.rot.m_data[0] = this_00->m_data[0];
      local_288.rot.m_data[1] = (this->outlet).rot.m_data[1];
      local_288.rot.m_data[2] = (this->outlet).rot.m_data[2];
      local_288.rot.m_data[3] = (this->outlet).rot.m_data[3];
    }
    local_238.pos.m_data[2] = dVar4 * DAT_011dd400;
    local_238.pos.m_data[1] = dVar4 * DAT_011dd3f8;
    local_238.pos.m_data[0] = dVar4 * VECT_X;
    ChCoordsys<double>::TransformLocalToParent
              ((ChVector<double> *)&local_328,&this->outlet,&local_238.pos);
    local_288.pos.m_data[0] = (this->outlet).pos.m_data[0] + (double)local_328._vptr_ChFrame;
    local_288.pos.m_data[1] = (this->outlet).pos.m_data[1] + local_328.coord.pos.m_data[0];
    local_288.pos.m_data[2] = (this->outlet).pos.m_data[2] + local_328.coord.pos.m_data[1];
    local_238.rot.m_data[0] = 1.0;
    local_238.rot.m_data[3] = 0.0;
    pCVar1 = &((local_3a8._M_ptr)->X0).coord.rot;
    local_238.rot.m_data[1] = 0.0;
    local_238.rot.m_data[2] = 0.0;
    if (pCVar1 != (ChQuaternion<double> *)((long)&local_238 + 0x18)) {
      local_238.rot.m_data[0] = pCVar1->m_data[0];
      local_238.rot.m_data[1] = ((local_3a8._M_ptr)->X0).coord.rot.m_data[1];
      local_238.rot.m_data[2] = ((local_3a8._M_ptr)->X0).coord.rot.m_data[2];
      local_238.rot.m_data[3] = ((local_3a8._M_ptr)->X0).coord.rot.m_data[3];
    }
    dVar4 = this->h;
    auVar7._0_8_ = dVar4 * VECT_X;
    auVar7._8_8_ = dVar4 * DAT_011dd3f8;
    local_238.pos.m_data._0_16_ =
         vsubpd_avx(*(undefined1 (*) [16])((local_3a8._M_ptr)->X0).coord.pos.m_data,auVar7);
    local_238.pos.m_data[2] = ((local_3a8._M_ptr)->X0).coord.pos.m_data[2] - dVar4 * DAT_011dd400;
    ChFrame<double>::ChFrame(&local_328,&local_288);
    chrono_types::make_shared<chrono::fea::ChNodeFEAxyzrot,_chrono::ChFrame<double>,_0>
              ((chrono_types *)&local_3b8,&local_328);
    peVar5 = local_3b8._M_ptr;
    local_1f8.m_data[2] = this->speed;
    local_1f8.m_data[0] = local_1f8.m_data[2] * VECT_X;
    local_1f8.m_data[1] = local_1f8.m_data[2] * DAT_011dd3f8;
    local_1f8.m_data[2] = local_1f8.m_data[2] * DAT_011dd400;
    ChQuaternion<double>::Rotate(this_00,&local_1f8);
    (**(code **)(*(long *)&(peVar5->super_ChNodeFEAbase).field_0x18 + 0x38))
              (&(peVar5->super_ChNodeFEAbase).field_0x18,&local_328);
    ChFrame<double>::ChFrame(&local_b0,&local_238);
    ChFrame<double>::operator=(&(local_3b8._M_ptr)->X0,&local_b0);
    pCVar2 = (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChNodeFEAxyzrot,void>(local_338,&local_3b8);
    ChMesh::AddNode(pCVar2,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_338);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_330);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::push_back(&this->beam_nodes,(value_type *)&local_3b8);
    peVar3 = (this->actuator).
             super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChNodeFEAxyzrot,void>(local_388,&local_3b8);
    std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChBody,void>
              (local_398,
               &(this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
    ChFrame<double>::ChFrame(&local_138,&local_288);
    ChFrame<double>::ChFrame(&local_1c0,&local_288);
    (**(code **)(*(long *)&(peVar3->super_ChLinkMotorLinear).super_ChLinkMotor.
                           super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink + 0x248))
              (peVar3,local_388,local_398,0,&local_138,&local_1c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_390);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_380);
    this_01 = (this->actuator).
              super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::make_shared<chrono::ChFunction_Const,double&>((double *)&local_328);
    local_298.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_328._vptr_ChFrame;
    local_298.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.coord.pos.m_data[0];
    local_328._vptr_ChFrame = (_func_int **)0x0;
    local_328.coord.pos.m_data[0] = 0.0;
    ChLinkMotorLinearSpeed::SetSpeedFunction(this_01,&local_298);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_298.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_328.coord);
    peVar3 = (this->actuator).
             super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(double *)&(peVar3->super_ChLinkMotorLinear).field_0x278 =
         *(double *)&(peVar3->super_ChLinkMotorLinear).field_0x278 - this->h;
    std::make_shared<chrono::fea::ChElementBeamEuler>();
    pCVar2 = (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChElementBeamEuler,void>
              (local_348,
               (__shared_ptr<chrono::fea::ChElementBeamEuler,_(__gnu_cxx::_Lock_policy)2> *)
               &local_328);
    ChMesh::AddElement(pCVar2,(shared_ptr<chrono::fea::ChElementBase> *)local_348);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_340);
    std::
    vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
    ::push_back(&this->beam_elems,(value_type *)&local_328);
    pp_Var6 = local_328._vptr_ChFrame;
    std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_358,&local_3b8);
    std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_368,&local_3a8);
    (*(*(_func_int ***)pp_Var6)[0x1a])(pp_Var6,&local_358,&local_368);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_368._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_358._M_refcount);
    this_03 = (__shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2> *)
              (local_328._vptr_ChFrame + 0x1a);
    std::__shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_248,
               &(this->beam_section).
                super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_03,&local_248);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_248._M_refcount);
    (*(*(_func_int ***)local_328._vptr_ChFrame)[0x15])(local_328._vptr_ChFrame,this->mysystem);
    this_02 = (this->contactcloud).
              super___shared_ptr<chrono::fea::ChContactSurfaceNodeCloud,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (this_02 != (ChContactSurfaceNodeCloud *)0x0) {
      std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_378,&local_3b8);
      ChContactSurfaceNodeCloud::AddNode
                (this_02,(shared_ptr<chrono::fea::ChNodeFEAxyzrot> *)&local_378,this->contact_radius
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_378._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_328.coord);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b8._M_refcount);
  }
  this->mytime = this->mysystem->ch_time;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3a8._M_refcount);
  return;
}

Assistant:

void ChExtruderBeamEuler::Update() {
    auto node1 = beam_nodes.back();
    ChVector<> P1 = node1->GetPos();
    double d1 = (outlet.TransformParentToLocal(P1)).x();

    // GetLog() << " d1=" << d1 << "\n";

    if (d1 >= 0) {
        double d0 = d1 - this->h;
        ChCoordsys<> C0;
        C0.rot = outlet.rot;
        C0.pos = outlet.pos + outlet.TransformLocalToParent(VECT_X * d0);
        ChCoordsys<> C0_ref;
        C0_ref.rot = node1->GetX0().GetRot();
        C0_ref.pos = node1->GetX0().GetPos() - VECT_X * this->h;

        auto node0 = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(C0));
        node0->SetPos_dt(outlet.TransformDirectionLocalToParent(VECT_X * this->speed));
        node0->SetX0(ChFrame<>(C0_ref));
        mesh->AddNode(node0);
        beam_nodes.push_back(node0);

        actuator->Initialize(node0, ground, false, ChFrame<>(C0), ChFrame<>(C0));
        actuator->SetSpeedFunction(chrono_types::make_shared<ChFunction_Const>(this->speed));
        actuator->SetMotionOffset(actuator->GetMotionOffset() - this->h);
        /*
        actuator->Initialize(node0, ground, false, ChFrame<>(C0), ChFrame<>(C0));
        actuator->SetMotionFunction(chrono_types::make_shared<ChFunction_Ramp>(0,this->speed));
        actuator->SetMotionOffset(actuator->GetMotionOffset() - this->h);
        */
        auto element = chrono_types::make_shared<ChElementBeamEuler>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(node0, node1);

        element->SetSection(this->beam_section);

        element->SetupInitial(mysystem);

        // add collision model to node
        if (this->contactcloud) {
            contactcloud->AddNode(node0, this->contact_radius);
        }
    }
    mytime = mysystem->GetChTime();
}